

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::clara::TextFlow::Column::iterator::calcLength(iterator *this)

{
  char cVar1;
  Column *pCVar2;
  pointer pbVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  void *pvVar7;
  bool bVar8;
  void *pvVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  
  pCVar2 = this->m_column;
  uVar11 = this->m_stringIndex;
  pbVar3 = (pCVar2->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pCVar2->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <= uVar11) {
    __assert_fail("m_stringIndex < m_column.m_strings.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pyxll[P]xlfparser/tests/catch.hpp"
                  ,0x1913,"void Catch::clara::TextFlow::Column::iterator::calcLength()");
  }
  this->m_suffix = false;
  uVar4 = this->m_pos;
  sVar10 = 0xffffffffffffffff;
  if (uVar4 == 0 && uVar11 == 0) {
    sVar10 = pCVar2->m_initialIndent;
  }
  if (sVar10 == 0xffffffffffffffff) {
    sVar10 = pCVar2->m_indent;
  }
  sVar10 = pCVar2->m_width - sVar10;
  uVar5 = *(size_type *)((long)(pbVar3 + uVar11) + 8);
  this->m_end = uVar4;
  uVar12 = uVar4;
  if (uVar4 < uVar5) {
    lVar6 = *(long *)&pbVar3[uVar11]._M_dataplus;
    uVar11 = uVar4;
    do {
      uVar12 = uVar11;
      if (*(char *)(lVar6 + uVar11) == '\n') break;
      uVar11 = uVar11 + 1;
      this->m_end = uVar11;
      uVar12 = uVar5;
    } while (uVar5 != uVar11);
  }
  if (sVar10 + uVar4 <= uVar12) {
    sVar13 = sVar10;
    if (sVar10 != 0) {
      do {
        bVar8 = isBoundary(this,this->m_pos + sVar13);
        if (bVar8) goto joined_r0x00143e2f;
        sVar13 = sVar13 - 1;
      } while (sVar13 != 0);
      sVar13 = 0;
    }
joined_r0x00143e2f:
    do {
      if (sVar13 == 0) goto LAB_00143e90;
      cVar1 = *(char *)((sVar13 - 1) +
                       *(long *)&(this->m_column->m_strings).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                                 _M_dataplus + this->m_pos);
      if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
        calcLength();
      }
      pvVar7 = isWhitespace(char)::chars_abi_cxx11_;
      if (((DAT_001c3500 == 0) ||
          (pvVar9 = memchr(isWhitespace(char)::chars_abi_cxx11_,(int)cVar1,DAT_001c3500),
          pvVar9 == (void *)0x0)) || ((long)pvVar9 - (long)pvVar7 == -1)) goto LAB_00143e9a;
      sVar13 = sVar13 - 1;
    } while( true );
  }
  sVar13 = uVar12 - uVar4;
LAB_00143e9a:
  this->m_len = sVar13;
  return;
LAB_00143e90:
  this->m_suffix = true;
  sVar13 = sVar10 - 1;
  goto LAB_00143e9a;
}

Assistant:

void calcLength() {
			assert(m_stringIndex < m_column.m_strings.size());

			m_suffix = false;
			auto width = m_column.m_width - indent();
			m_end = m_pos;
			while (m_end < line().size() && line()[m_end] != '\n')
				++m_end;

			if (m_end < m_pos + width) {
				m_len = m_end - m_pos;
			} else {
				size_t len = width;
				while (len > 0 && !isBoundary(m_pos + len))
					--len;
				while (len > 0 && isWhitespace(line()[m_pos + len - 1]))
					--len;

				if (len > 0) {
					m_len = len;
				} else {
					m_suffix = true;
					m_len = width - 1;
				}
			}
		}